

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *expected,
          tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *actual)

{
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  internal *local_30;
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *actual_local;
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = (internal *)expected;
  actual_local = (tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)actual_str;
  expected_local = (tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
                    (expected,(tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)actual_str)
  ;
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
              (&local_50,(internal *)actual_local,
               (tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_30,
               (tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)actual_str);
    FormatForComparisonFailureMessage<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
              (&local_70,local_30,actual_local,
               (tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,(char *)actual_expression,&local_50,
              &local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }